

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::GenerateFromSchema
          (NimBfbsGenerator *this,Schema *schema,CodeGenOptions *options)

{
  ushort uVar1;
  undefined8 uVar2;
  uint8_t *offset_location;
  Schema *pSVar3;
  uint8_t *offset_location_1;
  Schema *pSVar4;
  Schema *local_80;
  NimBfbsGenerator *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  NimBfbsGenerator *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  NimBfbsGenerator *local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->options_);
  if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(schema + (6 - (long)*(int *)schema));
  }
  if (uVar1 == 0) {
    pSVar4 = (Schema *)0x0;
  }
  else {
    pSVar4 = schema + (ulong)*(uint *)(schema + uVar1) + (ulong)uVar1;
  }
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:102:34)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_reflection::Enum_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:102:34)>
             ::_M_manager;
  local_58 = this;
  local_38 = this;
  if ((*(uint *)pSVar4 & 0x3fffffff) != 0) {
    pSVar3 = pSVar4 + 4;
    do {
      local_80 = pSVar3 + *(uint *)pSVar3;
      if (local_48 == (code *)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00330754;
      }
      (*pcStack_40)(&local_58,&local_80);
      pSVar3 = pSVar3 + 4;
    } while (pSVar3 != pSVar4 + 4 + (*(uint *)pSVar4 << 2));
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(schema + (4 - (long)*(int *)schema));
  }
  if (uVar1 == 0) {
    pSVar4 = (Schema *)0x0;
  }
  else {
    pSVar4 = schema + (ulong)*(uint *)(schema + uVar1) + (ulong)uVar1;
  }
  uStack_70 = 0;
  local_78 = local_38;
  pcStack_60 = std::
               _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:106:38)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_reflection::Object_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/bfbs_gen_nim.cpp:106:38)>
             ::_M_manager;
  if ((*(uint *)pSVar4 & 0x3fffffff) != 0) {
    pSVar3 = pSVar4 + 4;
    do {
      local_80 = pSVar3 + *(uint *)pSVar3;
      if (local_68 == (code *)0x0) {
LAB_00330754:
        uVar2 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar2);
      }
      (*pcStack_60)(&local_78,&local_80);
      pSVar3 = pSVar3 + 4;
    } while (pSVar3 != pSVar4 + 4 + (*(uint *)pSVar4 << 2));
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  return OK;
}

Assistant:

Status GenerateFromSchema(const r::Schema *schema,
                            const CodeGenOptions &options)
      FLATBUFFERS_OVERRIDE {
    options_ = options;
    ForAllEnums(schema->enums(), [&](const r::Enum *enum_def) {
      StartCodeBlock(enum_def);
      GenerateEnum(enum_def);
    });
    ForAllObjects(schema->objects(), [&](const r::Object *object) {
      StartCodeBlock(object);
      GenerateObject(object);
    });
    return OK;
  }